

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinationApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::
TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
serialize<DOCTEST_ANON_FUNC_6()::$_0>::operator()
          (serialize<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_CustomizingToStringTests_cpp:69:9)>
           *this,StringMakerPrintable *input1_,StringMakerPrintable *inputs)

{
  ostream *poVar1;
  char *pcVar2;
  int *in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  print_input *in_stack_ffffffffffffff78;
  tuple<StringMakerPrintable_&> *in_stack_ffffffffffffff80;
  StringMakerPrintable *in_stack_ffffffffffffffb8;
  string local_38 [32];
  int *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar1 = ::std::operator<<((ostream *)*in_RDI,"(");
  StringMaker::toString<StringMakerPrintable>(in_stack_ffffffffffffffb8);
  ::std::operator<<(poVar1,local_38);
  ::std::__cxx11::string::~string(local_38);
  ::std::forward_as_tuple<StringMakerPrintable&>((StringMakerPrintable *)in_stack_ffffffffffffff78);
  CartesianProduct::Detail::
  for_each<std::tuple<StringMakerPrintable&>,ApprovalTests::TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::print_input>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  poVar1 = ::std::operator<<((ostream *)*in_RDI,") => ");
  pcVar2 = DOCTEST_ANON_FUNC_6()::$_0::operator()
                     ((__0 *)(in_RDI + 1),(StringMakerPrintable)*local_10,
                      (StringMakerPrintable)*local_18);
  poVar1 = ::std::operator<<(poVar1,pcVar2);
  ::std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void operator()(T&& input1_, Ts&&... inputs)
            {
                // First value is printed without trailing comma
                out << "(" << TCompileTimeOptions::ToStringConverter::toString(input1_);
                // Remaining values are printed with prefix of a comma
                CartesianProduct::Detail::for_each(std::forward_as_tuple(inputs...),
                                                   print_input{out});
                out << ") => " << converter(input1_, inputs...) << '\n';
            }